

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::fill_big
          (vector_downward<unsigned_int> *this,size_t zero_pad_bytes)

{
  uint8_t *__s;
  size_t zero_pad_bytes_local;
  vector_downward<unsigned_int> *this_local;
  
  __s = make_space(this,zero_pad_bytes);
  memset(__s,0,zero_pad_bytes);
  return;
}

Assistant:

void fill_big(size_t zero_pad_bytes) {
    memset(make_space(zero_pad_bytes), 0, zero_pad_bytes);
  }